

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

bool __thiscall
sptk::reaper::EpochTracker::WriteDebugData
          (EpochTracker *this,vector<float,_std::allocator<float>_> *data,string *extension)

{
  size_type sVar1;
  pointer pcVar2;
  pointer __ptr;
  long *plVar3;
  FILE *__s;
  size_t sVar4;
  _func_int **pp_Var5;
  bool bVar6;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_68 [32];
  TrackerResults *local_48 [2];
  TrackerResults local_38;
  
  sVar1 = (this->debug_name_)._M_string_length;
  if (sVar1 == 0) {
    bVar6 = true;
  }
  else {
    pcVar2 = (this->debug_name_)._M_dataplus._M_p;
    local_48[0] = &local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)local_48);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_48,(ulong)(extension->_M_dataplus)._M_p);
    pp_Var5 = (_func_int **)(plVar3 + 2);
    if ((_func_int **)*plVar3 == pp_Var5) {
      local_68._16_8_ = *pp_Var5;
      local_68._24_8_ = plVar3[3];
      local_68._0_8_ = local_68 + 0x10;
    }
    else {
      local_68._16_8_ = *pp_Var5;
      local_68._0_8_ = (_func_int **)*plVar3;
    }
    local_68._8_8_ = plVar3[1];
    *plVar3 = (long)pp_Var5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_48[0] != &local_38) {
      operator_delete(local_48[0]);
    }
    if ((data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish ==
        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start) {
      bVar6 = false;
      fprintf(_stdout,"Data size==0 for %s in WriteDebugData\n",local_68._0_8_);
    }
    else {
      __s = fopen((char *)local_68._0_8_,"w");
      if (__s == (FILE *)0x0) {
        WriteDebugData((EpochTracker *)local_68);
        bVar6 = false;
      }
      else {
        __ptr = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
        sVar4 = fwrite(__ptr,4,(long)(data->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)__ptr >> 2,
                       __s);
        fclose(__s);
        bVar6 = sVar4 == (long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_start >> 2;
        if (!bVar6) {
          bVar6 = false;
          fprintf(_stderr,"Problems writing debug data (%d %d)\n",sVar4 & 0xffffffff);
        }
      }
    }
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  return bVar6;
}

Assistant:

bool EpochTracker::WriteDebugData(const std::vector<float>& data,
                                  const std::string& extension) {
  if (debug_name_.empty()) {
    return true;
  }
  std::string filename = debug_name_ + "." + extension;
  if (data.size() == 0) {
    fprintf(stdout, "Data size==0 for %s in WriteDebugData\n",
               filename.c_str());
    return false;
  }
  FILE* out = fopen(filename.c_str(), "w");
  if (!out) {
    fprintf(stderr, "Can't open %s for debug output\n", filename.c_str());
    return false;
  }
  size_t  written = fwrite(&(data.front()), sizeof(data.front()),
                           data.size(), out);
  fclose(out);
  if (written != data.size()) {
    fprintf(stderr, "Problems writing debug data (%d %d)\n",
            static_cast<int>(written), static_cast<int>(data.size()));
    return false;
  }
  return true;
}